

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::udp_tracker_connection::send_udp_connect(udp_tracker_connection *this)

{
  listen_socket_handle *sock;
  uint uVar1;
  tracker_manager *this_00;
  size_type sVar2;
  pointer pcVar3;
  byte bVar4;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  int iVar12;
  size_t *psVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__n;
  endpoint *ep;
  _Alloc_hider _Var14;
  shared_ptr<libtorrent::aux::request_callback> sVar15;
  span<const_char> p;
  span<const_char> in;
  error_code ec;
  string local_c0;
  shared_ptr<libtorrent::aux::request_callback> cb;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_90 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_80;
  array<char,_16UL> buf;
  string local_60;
  array<char,_22UL> local_3e;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  
  sVar15 = tracker_connection::requester((tracker_connection *)&cb);
  if (this->m_abort == true) {
    if (cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      (*(cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        )->_vptr_request_callback[7])
                (cb.
                 super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,"==> UDP_TRACKER_CONNECT [ skipped, m_abort ]",
                 sVar15.
                 super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._M_pi);
    }
    goto LAB_0037dda2;
  }
  buf._M_elems[0] = '\0';
  buf._M_elems[1] = '\0';
  buf._M_elems[2] = '\x04';
  buf._M_elems[3] = '\x17';
  buf._M_elems[4] = '\'';
  buf._M_elems[5] = '\x10';
  buf._M_elems[6] = '\x19';
  buf._M_elems[7] = -0x80;
  buf._M_elems[8] = '\0';
  buf._M_elems[9] = '\0';
  buf._M_elems[10] = '\0';
  buf._M_elems[0xb] = '\0';
  uVar1 = this->m_transaction_id;
  uVar8 = (ushort)(uVar1 >> 0x10) & 0xff;
  uVar9 = (ushort)(uVar1 >> 8) & 0xff;
  uVar10 = (ushort)uVar1 & 0xff;
  bVar4 = (byte)(uVar1 >> 0x18);
  uVar11 = (ushort)bVar4;
  bVar4 = (uVar11 != 0) * (uVar11 < 0x100) * bVar4 - (0xff < uVar11);
  bVar5 = ((uVar1 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar1 >> 0x10) - (0xff < uVar8);
  bVar6 = ((uVar1 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar1 >> 8) - (0xff < uVar9);
  bVar7 = ((uVar1 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar1 - (0xff < uVar10);
  buf._M_elems[0xd] = (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5);
  buf._M_elems[0xc] = (bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4);
  buf._M_elems[0xe] = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
  buf._M_elems[0xf] = (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7);
  ec.val_ = 0;
  ec.failed_ = false;
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  sock = &(this->super_tracker_connection).m_req.outgoing_socket;
  this_00 = (this->super_tracker_connection).m_man;
  if ((this->m_hostname)._M_string_length == 0) {
    __n = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&buf;
    tracker_manager::send(this_00,(int)sock,&this->m_target,(size_t)__n,0x10);
  }
  else {
    uVar11 = (this->m_target).impl_.data_.v4.sin_port;
    uVar11 = uVar11 << 8 | uVar11 >> 8;
    __n = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar11;
    p.m_len = 0x10;
    p.m_ptr = buf._M_elems;
    tracker_manager::send_hostname
              (this_00,sock,(this->m_hostname)._M_dataplus._M_p,(uint)uVar11,p,&ec,
               (udp_send_flags_t)0x2);
  }
  this->m_attempts = this->m_attempts + 1;
  if (ec.failed_ == true) {
    if ((cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         != (element_type *)0x0) &&
       (iVar12 = (*(cb.
                    super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->_vptr_request_callback[6])(), (char)iVar12 != '\0')) {
      (*(ec.cat_)->_vptr_error_category[4])(&local_c0,ec.cat_,(ulong)(uint)ec.val_);
      (*(cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        )->_vptr_request_callback[7])
                (cb.
                 super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,"==> UDP_TRACKER_CONNECT [ failed: %s ]",local_c0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
    fail(this,&ec,sock_write,"",(seconds32)0x0,(seconds32)0x1e);
    goto LAB_0037dda2;
  }
  if ((cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       != (element_type *)0x0) &&
     (iVar12 = (*(cb.
                  super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_vptr_request_callback[6])(), (char)iVar12 != '\0')) {
    sVar2 = (this->m_hostname)._M_string_length;
    if (sVar2 == 0) {
      print_endpoint_abi_cxx11_(&local_c0,(aux *)&this->m_target,ep);
    }
    else {
      local_90[0]._M_pi = &local_80;
      pcVar3 = (this->m_hostname)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>((string *)local_90,pcVar3,pcVar3 + sVar2);
      ::std::__cxx11::string::append((char *)local_90);
      uVar11 = (this->m_target).impl_.data_.v4.sin_port;
      to_string(&local_3e,(ulong)(ushort)(uVar11 << 8 | uVar11 >> 8));
      psVar13 = (size_t *)::std::__cxx11::string::append((char *)local_90);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      __n = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(psVar13 + 2);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*psVar13 == __n) {
        local_c0.field_2._M_allocated_capacity = (size_type)__n->_vptr__Sp_counted_base;
        local_c0.field_2._8_8_ = psVar13[3];
      }
      else {
        local_c0.field_2._M_allocated_capacity = (size_type)__n->_vptr__Sp_counted_base;
        local_c0._M_dataplus._M_p = (pointer)*psVar13;
      }
      local_c0._M_string_length = psVar13[1];
      *psVar13 = (size_t)__n;
      psVar13[1] = 0;
      *(undefined1 *)(psVar13 + 2) = 0;
    }
    _Var14._M_p = local_c0._M_dataplus._M_p;
    in.m_len = (difference_type)__n;
    in.m_ptr = (char *)0x14;
    to_hex_abi_cxx11_(&local_60,(aux *)&(this->super_tracker_connection).m_req.info_hash,in);
    (*(cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->_vptr_request_callback[7])
              (cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,"==> UDP_TRACKER_CONNECT [ to: %s ih: %s ]",_Var14._M_p,
               local_60._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,(ulong)(local_60.field_2._M_allocated_capacity + 1))
      ;
    }
    if (sVar2 == 0) {
      local_80._vptr__Sp_counted_base = (_func_int **)local_c0.field_2._M_allocated_capacity;
      _Var14._M_p = local_c0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) goto LAB_0037dd86;
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      _Var14._M_p = (pointer)local_90[0]._M_pi;
      if (local_90[0]._M_pi != &local_80) {
LAB_0037dd86:
        operator_delete(_Var14._M_p,(long)local_80._vptr__Sp_counted_base + 1);
      }
    }
  }
  this->m_state = connect;
  tracker_connection::sent_bytes(&this->super_tracker_connection,0x2c);
LAB_0037dda2:
  if (cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void udp_tracker_connection::send_udp_connect()
	{
#ifndef TORRENT_DISABLE_LOGGING
		std::shared_ptr<request_callback> cb = requester();
#endif

		if (m_abort)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (cb) cb->debug_log("==> UDP_TRACKER_CONNECT [ skipped, m_abort ]");
#endif
			return;
		}

		std::size_t const connect_packet_size = 16;
		std::array<char, connect_packet_size> buf;
		span<char> view = buf;

		TORRENT_ASSERT(m_transaction_id != 0);

		aux::write_uint32(0x417, view);
		aux::write_uint32(0x27101980, view); // connection_id
		aux::write_int32(action_t::connect, view); // action (connect)
		aux::write_int32(m_transaction_id, view); // transaction_id
		TORRENT_ASSERT(view.empty());

		error_code ec;
		if (!m_hostname.empty())
		{
			m_man.send_hostname(bind_socket(), m_hostname.c_str()
				, m_target.port(), buf, ec
				, udp_socket::tracker_connection);
		}
		else
		{
			m_man.send(bind_socket(), m_target, buf, ec
				, udp_socket::tracker_connection);
		}

		++m_attempts;
		if (ec)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (cb && cb->should_log())
			{
				cb->debug_log("==> UDP_TRACKER_CONNECT [ failed: %s ]"
					, ec.message().c_str());
			}
#endif
			fail(ec, operation_t::sock_write);
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (cb && cb->should_log())
		{
			cb->debug_log("==> UDP_TRACKER_CONNECT [ to: %s ih: %s ]"
				, m_hostname.empty()
					? print_endpoint(m_target).c_str()
					: (m_hostname + ":" + to_string(m_target.port()).data()).c_str()
				, aux::to_hex(tracker_req().info_hash).c_str());
		}
#endif

		m_state = action_t::connect;
		sent_bytes(16 + 28); // assuming UDP/IP header
	}